

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.cpp
# Opt level: O0

FSerializer * Serialize(FSerializer *arc,char *key,FString *pstr,FString *def)

{
  FWriter *this;
  bool bVar1;
  int iVar2;
  Value *this_00;
  Ch *cc;
  char *pcVar3;
  bool local_39;
  Value *val;
  FString *def_local;
  FString *pstr_local;
  char *key_local;
  FSerializer *arc_local;
  
  bVar1 = FSerializer::isWriting(arc);
  if (bVar1) {
    bVar1 = FWriter::inObject(arc->w);
    if (((!bVar1) || (def == (FString *)0x0)) || (iVar2 = FString::Compare(pstr,def), iVar2 != 0)) {
      FSerializer::WriteKey(arc,key);
      this = arc->w;
      pcVar3 = FString::GetChars(pstr);
      FWriter::String(this,pcVar3);
    }
  }
  else {
    this_00 = FReader::FindKey(arc->r,key);
    if (this_00 != (Value *)0x0) {
      bVar1 = rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::IsNull(this_00);
      local_39 = true;
      if (!bVar1) {
        local_39 = rapidjson::
                   GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   ::IsString(this_00);
      }
      if (local_39 == false) {
        __assert_fail("val->IsNull() || val->IsString()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/serializer.cpp"
                      ,0x83e,
                      "FSerializer &Serialize(FSerializer &, const char *, FString &, FString *)");
      }
      bVar1 = rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::IsNull(this_00);
      if (bVar1) {
        FString::operator=(pstr,"");
      }
      else {
        bVar1 = rapidjson::
                GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                ::IsString(this_00);
        if (bVar1) {
          cc = rapidjson::
               GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               ::GetString(this_00);
          pcVar3 = UnicodeToString(cc);
          FString::operator=(pstr,pcVar3);
        }
        else {
          Printf("\x1cGstring expected for \'%s\'",key);
          FString::operator=(pstr,"");
          arc->mErrors = arc->mErrors + 1;
        }
      }
    }
  }
  return arc;
}

Assistant:

FSerializer &Serialize(FSerializer &arc, const char *key, FString &pstr, FString *def)
{
	if (arc.isWriting())
	{
		if (!arc.w->inObject() || def == nullptr || pstr.Compare(*def) != 0)
		{
			arc.WriteKey(key);
			arc.w->String(pstr.GetChars());
		}
	}
	else
	{
		auto val = arc.r->FindKey(key);
		if (val != nullptr)
		{
			assert(val->IsNull() || val->IsString());
			if (val->IsNull())
			{
				pstr = "";
			}
			else if (val->IsString())
			{
				pstr = UnicodeToString(val->GetString());
			}
			else
			{
				Printf(TEXTCOLOR_RED "string expected for '%s'", key);
				pstr = "";
				arc.mErrors++;
			}
		}
	}
	return arc;

}